

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLDriver::removeOcclusionQuery(COpenGLDriver *this,ISceneNode *node)

{
  SOccQuery *pSVar1;
  pointer pSVar2;
  __normal_iterator<const_irr::video::CNullDriver::SOccQuery_*,_std::vector<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>_>
  _Var3;
  code *pcVar4;
  ulong uVar5;
  SOccQuery local_48;
  
  local_48.Mesh = (IMesh *)0x0;
  local_48.field_2.PID = (void *)0x0;
  local_48.Result = 0xffffffff;
  local_48.Run = 0xffffffff;
  if (node != (ISceneNode *)0x0) {
    *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) =
         *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) + 1;
  }
  local_48.Node = node;
  _Var3 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SOccQuery_const*,std::vector<irr::video::CNullDriver::SOccQuery,std::allocator<irr::video::CNullDriver::SOccQuery>>>,__gnu_cxx::__ops::_Iter_equals_val<irr::video::CNullDriver::SOccQuery_const>>
                    ((this->super_CNullDriver).OcclusionQueries.m_data.
                     super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->super_CNullDriver).OcclusionQueries.m_data.
                     super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_48);
  pSVar1 = (this->super_CNullDriver).OcclusionQueries.m_data.
           super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)_Var3._M_current -
          (long)(this->super_CNullDriver).OcclusionQueries.m_data.
                super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                ._M_impl.super__Vector_impl_data._M_start;
  CNullDriver::SOccQuery::~SOccQuery(&local_48);
  if ((int)(~uVar5 >> 5) != 0 && _Var3._M_current != pSVar1) {
    pSVar2 = (this->super_CNullDriver).OcclusionQueries.m_data.
             super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = uVar5 & 0x1fffffffe0;
    if ((*(int *)((long)&pSVar2->field_2 + uVar5) != 0) &&
       ((pcVar4 = *(code **)&this->field_0xa40, pcVar4 != (code *)0x0 ||
        (pcVar4 = *(code **)&this->field_0xa80, pcVar4 != (code *)0x0)))) {
      (*pcVar4)(1,(long)&pSVar2->field_2 + uVar5);
    }
    CNullDriver::removeOcclusionQuery(&this->super_CNullDriver,node);
  }
  return;
}

Assistant:

void COpenGLDriver::removeOcclusionQuery(scene::ISceneNode *node)
{
	const s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index != -1) {
		if (OcclusionQueries[index].UID != 0)
			extGlDeleteQueries(1, reinterpret_cast<GLuint *>(&OcclusionQueries[index].UID));
		CNullDriver::removeOcclusionQuery(node);
	}
}